

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_long> * __thiscall
cimg_library::CImg<unsigned_long>::fill(CImg<unsigned_long> *this,unsigned_long val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long *__s;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar6 = _DAT_00145460;
  auVar5 = _DAT_00145450;
  __s = this->_data;
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  if (uVar4 != 0 && ((uVar3 != 0 && uVar2 != 0) && (uVar1 != 0 && __s != (unsigned_long *)0x0))) {
    if (val == 0) {
      memset(__s,0,(ulong)uVar3 * (ulong)uVar4 * (ulong)uVar1 * (ulong)uVar2 * 8);
    }
    else {
      lVar10 = (ulong)uVar3 * (ulong)uVar4 * (ulong)uVar2 * (ulong)uVar1;
      if (0 < lVar10) {
        puVar8 = __s + 1;
        if (__s + 1 < __s + lVar10) {
          puVar8 = __s + lVar10;
        }
        uVar7 = ~(ulong)__s + (long)puVar8;
        auVar13._8_4_ = (int)uVar7;
        auVar13._0_8_ = uVar7;
        auVar13._12_4_ = (int)(uVar7 >> 0x20);
        auVar11._0_8_ = uVar7 >> 3;
        auVar11._8_8_ = auVar13._8_8_ >> 3;
        uVar9 = 0;
        auVar11 = auVar11 ^ _DAT_00145460;
        do {
          auVar12._8_4_ = (int)uVar9;
          auVar12._0_8_ = uVar9;
          auVar12._12_4_ = (int)(uVar9 >> 0x20);
          auVar13 = (auVar12 | auVar5) ^ auVar6;
          if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                      auVar11._4_4_ < auVar13._4_4_) & 1)) {
            __s[uVar9] = val;
          }
          if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
              auVar13._12_4_ <= auVar11._12_4_) {
            __s[uVar9 + 1] = val;
          }
          uVar9 = uVar9 + 2;
        } while (((uVar7 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,sizeof(T)*size());
      return *this;
    }